

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_FormatDateTime
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  Type ppvVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  int32_t iVar7;
  charcount_t cVar8;
  charcount_t cVar9;
  undefined4 *puVar10;
  Var pvVar11;
  StringCache *pSVar12;
  JavascriptBoolean *pJVar13;
  JavascriptString *this;
  void **resource;
  undefined8 uVar14;
  char *pcVar15;
  char *pcVar16;
  undefined4 extraout_var;
  undefined8 uVar17;
  LPCSTR pCVar18;
  Recycler *pRVar19;
  undefined4 extraout_var_00;
  Recycler *pRVar20;
  UChar *buf;
  JavascriptArray *arr;
  JavascriptString *pJVar21;
  JavascriptString *pJVar22;
  char16_t *pcVar23;
  char *error;
  int iVar24;
  char16_t *form;
  uint uVar25;
  int iVar26;
  double dVar27;
  uint in_stack_00000010;
  undefined8 in_stack_fffffffffffffe88;
  undefined4 uVar28;
  undefined1 local_168 [8];
  int partStart;
  size_t local_158;
  char *local_150;
  DWORD local_148;
  Type local_c0;
  Var cachedUDateFormat;
  JavascriptString *local_b0;
  double local_a8;
  double date;
  int partEnd;
  ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70> *local_90;
  undefined1 local_88 [8];
  Arguments args;
  FinalizableUDateFormat *dtf;
  UChar *local_68;
  ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70> local_60;
  ScopedUFieldPositionIterator fpi;
  UErrorCode local_44;
  JavascriptLibrary *pJStack_40;
  UErrorCode status_1;
  int local_34 [2];
  UErrorCode status;
  
  uVar28 = (undefined4)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar25 = callInfo._0_4_;
  if (in_stack_00000010 != uVar25) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x9e9,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00a2d8f2;
    *puVar10 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  local_88 = (undefined1  [8])callInfo;
  if ((uVar25 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x9e9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00a2d8f2;
    *puVar10 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar25 & 0xffffff) == 5) {
    pvVar11 = Arguments::operator[]((Arguments *)local_88,1);
    bVar4 = DynamicObject::IsBaseDynamicObject(pvVar11);
    if (!bVar4) goto LAB_00a2cb08;
    pvVar11 = Arguments::operator[]((Arguments *)local_88,2);
    bVar4 = TaggedInt::Is(pvVar11);
    if ((!bVar4) &&
       (pvVar11 = Arguments::operator[]((Arguments *)local_88,2), (ulong)pvVar11 >> 0x32 == 0))
    goto LAB_00a2cb08;
    pvVar11 = Arguments::operator[]((Arguments *)local_88,3);
    bVar4 = VarIs<Js::JavascriptBoolean>(pvVar11);
    if (!bVar4) goto LAB_00a2cb08;
    pvVar11 = Arguments::operator[]((Arguments *)local_88,4);
    bVar4 = VarIs<Js::JavascriptBoolean>(pvVar11);
    if (!bVar4) goto LAB_00a2cb08;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x9e9,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar4) goto LAB_00a2d8f2;
      *puVar10 = 0;
    }
LAB_00a2cb08:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xa2b,
                                "((args.Info.Count == 5 && DynamicObject::IsBaseDynamicObject(args[1]) && (TaggedInt::Is(args[2]) || JavascriptNumber::Is(args[2])) && VarIs<JavascriptBoolean>(args[3]) && VarIs<JavascriptBoolean>(args[4])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar4) goto LAB_00a2d8f2;
    *puVar10 = 0;
  }
  pvVar11 = Arguments::operator[]((Arguments *)local_88,1);
  pSVar12 = (StringCache *)UnsafeVarTo<Js::DynamicObject>(pvVar11);
  pvVar11 = Arguments::operator[]((Arguments *)local_88,3);
  pJVar13 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar11);
  iVar26 = pJVar13->value;
  pvVar11 = Arguments::operator[]((Arguments *)local_88,2);
  local_a8 = JavascriptDate::TimeClip(pvVar11);
  BVar5 = JavascriptNumber::IsNan(local_a8);
  if (BVar5 != 0) {
    JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ebfc,(PCWSTR)0x0);
  }
  pvVar11 = Arguments::operator[]((Arguments *)local_88,4);
  pJVar13 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar11);
  pcVar23 = L"%S(): Calling DateTimeFormat.prototype.formatToParts(new Date(%f))\n";
  if (iVar26 == 0) {
    pcVar23 = L"%S(): Calling DateTimeFormat.prototype.format(new Date(%f))\n";
  }
  form = L"%S(): Calling new Date(%f).toLocaleString(...)\n";
  if (pJVar13->value == 0) {
    form = pcVar23;
  }
  Output::Trace(IntlPhase,form,local_a8,"EntryIntl_FormatDateTime");
  local_c0 = (Type)0x0;
  args.Values = (Type)0x0;
  local_34[0] = 0;
  iVar6 = (*(((RecyclableObject *)&pSVar12->scriptContext)->super_FinalizableObject).
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                    (pSVar12,pSVar12,0xb,&local_c0,0,pSVar1);
  if (iVar6 == 0) {
    pJVar21 = AssertStringProperty((DynamicObject *)pSVar12,(PropertyIds)0x20d);
    pJVar22 = AssertStringProperty((DynamicObject *)pSVar12,(PropertyIds)0x274);
    pJStack_40 = (JavascriptLibrary *)pSVar12;
    this = AssertStringProperty((DynamicObject *)pSVar12,(PropertyIds)0x272);
    memset((char (*) [157])local_168,0,0x9d);
    cachedUDateFormat = pJVar21;
    LangtagToLocaleID<157ul>(pJVar21,(char (*) [157])local_168);
    pRVar20 = pSVar1->recycler;
    iVar6 = (*(pJVar22->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(pJVar22);
    fpi.object = (UFieldPositionIterator *)pJVar22;
    cVar8 = JavascriptString::GetLength(pJVar22);
    iVar24 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[0x65])(this);
    local_b0 = this;
    cVar9 = JavascriptString::GetLength(this);
    resource = (void **)udat_open_70(0xfffffffffffffffe,0xfffffffe,local_168,iVar6,cVar8,iVar24,
                                     CONCAT44(uVar28,cVar9),local_34);
    args.Values = (Type)FinalizableICUObject<void_**,_&udat_close_70>::New(pRVar20,resource);
    pSVar12 = (StringCache *)pJStack_40;
    if (local_34[0] == 7) goto LAB_00a2d904;
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      pCVar18 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xa66,"(false)",pCVar18);
      if (!bVar4) goto LAB_00a2d8f2;
      *puVar10 = 0;
    }
    uVar14 = udat_getCalendar_70(args.Values[1]);
    pcVar15 = (char *)ucal_getType_70(uVar14,local_34);
    if (local_34[0] == 7) goto LAB_00a2d904;
    if (local_34[0] < 1 && local_34[0] != -0x7c) {
      if (pcVar15 == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        error = "(calType != nullptr)";
        pcVar16 = "calType != nullptr";
        goto LAB_00a2ce7a;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      pcVar16 = (char *)u_errorName_70(local_34[0]);
      error = "(false)";
LAB_00a2ce7a:
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xa6d,error,pcVar16);
      if (!bVar4) goto LAB_00a2d8f2;
      *puVar10 = 0;
    }
    iVar6 = strcmp(pcVar15,"gregorian");
    if (iVar6 == 0) {
      ucal_setGregorianChange_70(0xc33eb208c2dc0000,uVar14,local_34);
      dVar27 = (double)ucal_getGregorianChange_70(uVar14,local_34);
      if (local_34[0] == 7) {
LAB_00a2d904:
        Throw::OutOfMemory();
      }
      if (local_34[0] < 1 && local_34[0] != -0x7c) {
        if ((dVar27 == -8.64e+15) && (!NAN(dVar27))) goto LAB_00a2cf83;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        pcVar16 = "(beginningOfTime == actualGregorianChange)";
        pcVar15 = "beginningOfTime == actualGregorianChange";
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        pcVar15 = (char *)u_errorName_70(local_34[0]);
        pcVar16 = "(false)";
      }
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xa73,pcVar16,pcVar15);
      if (!bVar4) goto LAB_00a2d8f2;
      *puVar10 = 0;
    }
LAB_00a2cf83:
    ppvVar3 = args.Values;
    uVar14 = (**(code **)(*cachedUDateFormat + 0x328))();
    iVar6 = (*(local_b0->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
    uVar17 = (**(code **)(*(long *)fpi.object + 0x328))();
    Output::Trace(IntlPhase,
                  L"%S(): Caching new UDateFormat (0x%x) with langtag=%s, pattern=%s, timezone=%s\n"
                  ,"EntryIntl_FormatDateTime",ppvVar3,uVar14,CONCAT44(extraout_var,iVar6),uVar17);
    (*(code *)(((ScriptContext *)
               (((RecyclableObject *)&pSVar12->scriptContext)->super_FinalizableObject).
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject)->noSpecialPropertyRegistry
              ).threadRegistry)(pSVar12,0xb,args.Values,0,0);
  }
  else {
    args.Values = local_c0;
    Output::Trace(IntlPhase,L"%S(): Using previously cached UDateFormat (0x%x)\n",
                  "EntryIntl_FormatDateTime");
  }
  if (iVar26 == 0) {
    pRVar20 = pSVar1->recycler;
    local_60.object = (UFieldPositionIterator *)((ulong)local_60.object._4_4_ << 0x20);
    local_168 = (undefined1  [8])&char16_t::typeinfo;
    _partStart = 0;
    local_158 = 8;
    local_150 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
    ;
    local_148 = 0x159;
    date = (double)&args.Values;
    _partEnd = &local_a8;
    pRVar19 = Memory::Recycler::TrackAllocInfo(pRVar20,(TrackAllocData *)local_168);
    buf = (UChar *)new__<Memory::Recycler>(0x10,pRVar19,0x37fe86);
    cVar8 = EntryIntl_FormatDateTime::anon_class_16_2_20bc470f::operator()
                      ((anon_class_16_2_20bc470f *)&date,buf,8,(UErrorCode *)&local_60);
    if ((int)cVar8 < 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15b,
                                  "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)"
                                  ,"allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0"
                                 );
      if (!bVar4) goto LAB_00a2d8f2;
      *puVar10 = 0;
    }
    if (((int)local_60.object == 0xf) || ((int)local_60.object == -0x7c)) {
      if ((int)cVar8 < 8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x15e,"(*returnLength >= firstTryLength)",
                                    "Executor reported buffer failure but did not require additional space"
                                   );
        if (!bVar4) goto LAB_00a2d8f2;
        *puVar10 = 0;
      }
      uVar25 = cVar8 + 1;
      Output::Trace(IntlPhase,
                    L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                    "EnsureBuffer",8,(ulong)uVar25);
      local_60.object = local_60.object & 0xffffffff00000000;
      local_168 = (undefined1  [8])&char16_t::typeinfo;
      _partStart = 0;
      local_150 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
      ;
      local_148 = 0x162;
      local_158 = (long)(int)uVar25;
      pRVar20 = Memory::Recycler::TrackAllocInfo(pRVar20,(TrackAllocData *)local_168);
      buf = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                      ((Memory *)pRVar20,(Recycler *)Memory::Recycler::AllocLeaf,0,(long)(int)uVar25
                      );
      cVar9 = EntryIntl_FormatDateTime::anon_class_16_2_20bc470f::operator()
                        ((anon_class_16_2_20bc470f *)&date,buf,uVar25,(UErrorCode *)&local_60);
      if (cVar9 != cVar8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x164,"(*returnLength == secondTryLength - 1)",
                                    "Second try of executor returned unexpected length");
        cVar8 = cVar9;
        goto joined_r0x00a2d4ed;
      }
    }
    else if (7 < (int)cVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x168,"(*returnLength < firstTryLength)",
                                  "Executor required additional length but reported successful status"
                                 );
joined_r0x00a2d4ed:
      if (!bVar4) goto LAB_00a2d8f2;
      *puVar10 = 0;
    }
    if ((int)local_60.object < 1 && (int)local_60.object != -0x7c) {
LAB_00a2d8cc:
      pJVar21 = JavascriptString::NewWithBuffer(buf,cVar8,pSVar1);
      return pJVar21;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    pCVar18 = (LPCSTR)u_errorName_70((ulong)local_60.object & 0xffffffff);
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar18);
    if (bVar4) {
      *puVar10 = 0;
      goto LAB_00a2d8cc;
    }
    goto LAB_00a2d8f2;
  }
  local_60.object = (UFieldPositionIterator *)ufieldpositer_open_70(local_34);
  if (local_34[0] == 7) {
    Throw::OutOfMemory();
  }
  if (0 < local_34[0] || local_34[0] == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    pCVar18 = (LPCSTR)u_errorName_70(local_34[0]);
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xa92,"(false)",pCVar18);
    if (!bVar4) goto LAB_00a2d8f2;
    *puVar10 = 0;
  }
  pRVar20 = pSVar1->recycler;
  local_44 = U_ZERO_ERROR;
  local_90 = &local_60;
  local_168 = (undefined1  [8])&char16_t::typeinfo;
  _partStart = 0;
  local_158 = 8;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
  ;
  local_148 = 0x159;
  date = (double)&args.Values;
  _partEnd = &local_a8;
  pRVar19 = Memory::Recycler::TrackAllocInfo(pRVar20,(TrackAllocData *)local_168);
  local_68 = (UChar *)new__<Memory::Recycler>(0x10,pRVar19,0x37fe86);
  iVar7 = EntryIntl_FormatDateTime::anon_class_24_3_b29ebb90::operator()
                    ((anon_class_24_3_b29ebb90 *)&date,local_68,8,&local_44);
  fpi.object = (UFieldPositionIterator *)CONCAT44(extraout_var_00,iVar7);
  if (iVar7 < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar4) goto LAB_00a2d8f2;
    *puVar10 = 0;
  }
  if ((local_44 == U_BUFFER_OVERFLOW_ERROR) || (local_44 == U_STRING_NOT_TERMINATED_WARNING)) {
    if ((int)(uint)fpi.object < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar4) goto LAB_00a2d8f2;
      *puVar10 = 0;
    }
    uVar25 = (int)fpi.object + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar25);
    local_44 = U_ZERO_ERROR;
    local_168 = (undefined1  [8])&char16_t::typeinfo;
    _partStart = 0;
    local_150 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
    ;
    local_148 = 0x162;
    local_158 = (long)(int)uVar25;
    pRVar20 = Memory::Recycler::TrackAllocInfo(pRVar20,(TrackAllocData *)local_168);
    local_68 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                         ((Memory *)pRVar20,(Recycler *)Memory::Recycler::AllocLeaf,0,
                          (long)(int)uVar25);
    uVar25 = EntryIntl_FormatDateTime::anon_class_24_3_b29ebb90::operator()
                       ((anon_class_24_3_b29ebb90 *)&date,local_68,uVar25,&local_44);
    if (uVar25 != (uint)fpi.object) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      if (!bVar4) goto LAB_00a2d8f2;
      fpi.object = (UFieldPositionIterator *)(ulong)uVar25;
      goto LAB_00a2d54f;
    }
  }
  else if (7 < (int)(uint)fpi.object) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
    if (!bVar4) goto LAB_00a2d8f2;
LAB_00a2d54f:
    *puVar10 = 0;
  }
  if (U_ZERO_ERROR < local_44 || local_44 == U_STRING_NOT_TERMINATED_WARNING) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    pCVar18 = (LPCSTR)u_errorName_70(local_44);
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar18);
    if (!bVar4) goto LAB_00a2d8f2;
    *puVar10 = 0;
  }
  pJStack_40 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  arr = JavascriptLibrary::CreateArray(pJStack_40,0);
  local_168 = (undefined1  [8])((ulong)local_168 & 0xffffffff00000000);
  date = (double)((ulong)date & 0xffffffff00000000);
  iVar6 = ufieldpositer_next_70(local_60.object);
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pJStack_40 = (JavascriptLibrary *)&pJStack_40->stringCache;
  iVar26 = 0;
  iVar24 = 0;
  while (-1 < iVar6) {
    if ((date._0_4_ <= (int)local_168._0_4_) || ((int)(uint)fpi.object < date._0_4_)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xaa5,"(partStart < partEnd && partEnd <= formattedLen)",
                                  "partStart < partEnd && partEnd <= formattedLen");
      if (!bVar4) goto LAB_00a2d8f2;
      *puVar10 = 0;
    }
    switch(iVar6) {
    case 0:
      pJVar21 = StringCache::GetIntlEraPart((StringCache *)pJStack_40);
      break;
    case 1:
    case 0x14:
    case 0x1e:
      pJVar21 = StringCache::GetIntlYearPart((StringCache *)pJStack_40);
      break;
    case 2:
    case 0x1a:
      pJVar21 = StringCache::GetIntlMonthPart((StringCache *)pJStack_40);
      break;
    case 3:
      pJVar21 = StringCache::GetIntlDayPart((StringCache *)pJStack_40);
      break;
    case 4:
    case 5:
    case 0xf:
    case 0x10:
      pJVar21 = StringCache::GetIntlHourPart((StringCache *)pJStack_40);
      break;
    case 6:
      pJVar21 = StringCache::GetIntlMinutePart((StringCache *)pJStack_40);
      break;
    case 7:
      pJVar21 = StringCache::GetIntlSecondPart((StringCache *)pJStack_40);
      break;
    default:
      pJVar21 = StringCache::GetIntlUnknownPart((StringCache *)pJStack_40);
      break;
    case 9:
    case 0x13:
    case 0x19:
      pJVar21 = StringCache::GetIntlWeekdayPart((StringCache *)pJStack_40);
      break;
    case 0xe:
      pJVar21 = StringCache::GetIntlDayPeriodPart((StringCache *)pJStack_40);
      break;
    case 0x11:
    case 0x17:
    case 0x18:
    case 0x1d:
    case 0x1f:
    case 0x20:
    case 0x21:
      pJVar21 = StringCache::GetIntlTimeZoneNamePart((StringCache *)pJStack_40);
    }
    uVar28 = local_168._0_4_;
    if (iVar26 < (int)local_168._0_4_) {
      pJVar22 = StringCache::GetIntlLiteralPart((StringCache *)pJStack_40);
      AddPartToPartsArray(pSVar1,arr,iVar24,local_68,iVar26,uVar28,pJVar22);
      iVar24 = iVar24 + 1;
    }
    AddPartToPartsArray(pSVar1,arr,iVar24,local_68,local_168._0_4_,date._0_4_,pJVar21);
    iVar26 = date._0_4_;
    iVar6 = ufieldpositer_next_70(local_60.object,local_168,&date);
    iVar24 = iVar24 + 1;
  }
  if (iVar26 != (uint)fpi.object) {
    if ((int)(uint)fpi.object <= iVar26) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xae6,"(lastPartEnd < formattedLen)","lastPartEnd < formattedLen"
                                 );
      if (!bVar4) {
LAB_00a2d8f2:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar10 = 0;
    }
    pJVar21 = StringCache::GetIntlLiteralPart((StringCache *)pJStack_40);
    AddPartToPartsArray(pSVar1,arr,iVar24,local_68,iVar26,(int)fpi.object,pJVar21);
  }
  PlatformAgnostic::ICUHelpers::ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70>::
  ~ScopedICUObject(&local_60);
  return arr;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_FormatDateTime(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#ifdef INTL_WINGLOB
        if (args.Info.Count < 3 || !(TaggedInt::Is(args.Values[1]) || JavascriptNumber::Is(args.Values[1])) || !DynamicObject::IsBaseDynamicObject(args.Values[2]))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        Windows::Foundation::DateTime winDate;
        HRESULT hr;
        if (TaggedInt::Is(args.Values[1]))
        {
            hr = Js::DateUtilities::ES5DateToWinRTDate(TaggedInt::ToInt32(args.Values[1]), &(winDate.UniversalTime));
        }
        else
        {
            hr = Js::DateUtilities::ES5DateToWinRTDate(JavascriptNumber::GetValue(args.Values[1]), &(winDate.UniversalTime));
        }
        if (FAILED(hr))
        {
            HandleOOMSOEHR(hr);
            // If conversion failed, double value is outside the range of WinRT DateTime
            Js::JavascriptError::ThrowRangeError(scriptContext, JSERR_OutOfDateTimeRange);
        }

        DynamicObject* obj = VarTo<DynamicObject>(args.Values[2]);
        Var hiddenObject = nullptr;
        AssertOrFailFastMsg(obj->GetInternalProperty(obj, Js::InternalPropertyIds::HiddenObject, &hiddenObject, NULL, scriptContext),
            "EntryIntl_FormatDateTime: Could not retrieve hiddenObject.");

        //We are going to perform the same check for timeZone as when caching the formatter.
        Var propertyValue = nullptr;
        AutoHSTRING result;

        //If timeZone is undefined; then use the standard dateTimeFormatter to format in local time; otherwise use the IDateTimeFormatter2 to format using specified timezone (UTC)
        if (!GetPropertyBuiltInFrom(obj, __timeZone) || JavascriptOperators::IsUndefinedObject(propertyValue))
        {
            DateTimeFormatting::IDateTimeFormatter *formatter = static_cast<DateTimeFormatting::IDateTimeFormatter *>(((AutoCOMJSObject *)hiddenObject)->GetInstance());
            Assert(formatter);
            IfFailThrowHr(formatter->Format(winDate, &result));
        }
        else
        {
            DateTimeFormatting::IDateTimeFormatter2 *formatter = static_cast<DateTimeFormatting::IDateTimeFormatter2 *>(((AutoCOMJSObject *)hiddenObject)->GetInstance());
            Assert(formatter);
            HSTRING timeZone;
            HSTRING_HEADER timeZoneHeader;

            // IsValidTimeZone() has already verified that this is JavascriptString.
            JavascriptString* userDefinedTimeZoneId = VarTo<JavascriptString>(propertyValue);
            IfFailThrowHr(WindowsCreateStringReference(userDefinedTimeZoneId->GetSz(), userDefinedTimeZoneId->GetLength(), &timeZoneHeader, &timeZone));
            Assert(timeZone);

            IfFailThrowHr(formatter->FormatUsingTimeZone(winDate, timeZone, &result));
        }
        PCWSTR strBuf = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary()->WindowsGetStringRawBuffer(*result, NULL);

        return Js::JavascriptString::NewCopySz(strBuf, scriptContext);
#else
        // This function vaguely implements ECMA 402 #sec-partitiondatetimepattern
        INTL_CHECK_ARGS(
            args.Info.Count == 5 &&
            DynamicObject::IsBaseDynamicObject(args[1]) &&
            (TaggedInt::Is(args[2]) || JavascriptNumber::Is(args[2])) &&
            VarIs<JavascriptBoolean>(args[3]) &&
            VarIs<JavascriptBoolean>(args[4])
        );

        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[1]);
        bool toParts = Js::UnsafeVarTo<Js::JavascriptBoolean>(args[3])->GetValue();

        // 1. Let x be TimeClip(x)
        // 2. If x is NaN, throw a RangeError exception
        double date = JavascriptDate::TimeClip(args[2]);
        if (JavascriptNumber::IsNan(date))
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidDate);
        }

        bool forDatePrototypeToLocaleString = UnsafeVarTo<JavascriptBoolean>(args[4])->GetValue();
        if (forDatePrototypeToLocaleString)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Date_Prototype_toLocaleString);
            INTL_TRACE("Calling new Date(%f).toLocaleString(...)", date);
        }
        else if (toParts)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(DateTimeFormat_Prototype_formatToParts);
            INTL_TRACE("Calling DateTimeFormat.prototype.formatToParts(new Date(%f))", date);
        }
        else
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(DateTimeFormat_Prototype_format);
            INTL_TRACE("Calling DateTimeFormat.prototype.format(new Date(%f))", date);
        }

        // Below, we lazy-initialize the backing UDateFormat on the first call to format{ToParts}
        // On subsequent calls, the UDateFormat will be cached in state.CachedUDateFormat
        Var cachedUDateFormat = nullptr;
        FinalizableUDateFormat *dtf = nullptr;
        UErrorCode status = U_ZERO_ERROR;
        if (state->GetInternalProperty(state, InternalPropertyIds::CachedUDateFormat, &cachedUDateFormat, nullptr, scriptContext))
        {
            dtf = reinterpret_cast<FinalizableUDateFormat *>(cachedUDateFormat);
            INTL_TRACE("Using previously cached UDateFormat (0x%x)", dtf);
        }
        else
        {
            JavascriptString *langtag = AssertStringProperty(state, PropertyIds::locale);
            JavascriptString *timeZone = AssertStringProperty(state, PropertyIds::timeZone);
            JavascriptString *pattern = AssertStringProperty(state, PropertyIds::pattern);

            char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
            LangtagToLocaleID(langtag, localeID);

            dtf = FinalizableUDateFormat::New(scriptContext->GetRecycler(), udat_open(
                UDAT_PATTERN,
                UDAT_PATTERN,
                localeID,
                reinterpret_cast<const UChar *>(timeZone->GetSz()),
                timeZone->GetLength(),
                reinterpret_cast<const UChar *>(pattern->GetSz()),
                pattern->GetLength(),
                &status
            ));
            ICU_ASSERT(status, true);

            // DateTimeFormat is expected to use the "proleptic Gregorian calendar", which means that the Julian calendar should never be used.
            // To accomplish this, we can set the switchover date between julian/gregorian
            // to the ECMAScript beginning of time, which is -8.64e15 according to ecma262 #sec-time-values-and-time-range
            UCalendar *cal = const_cast<UCalendar *>(udat_getCalendar(*dtf));
            const char *calType = ucal_getType(cal, &status);
            ICU_ASSERT(status, calType != nullptr);
            if (strcmp(calType, "gregorian") == 0)
            {
                double beginningOfTime = -8.64e15;
                ucal_setGregorianChange(cal, beginningOfTime, &status);
                double actualGregorianChange = ucal_getGregorianChange(cal, &status);
                ICU_ASSERT(status, beginningOfTime == actualGregorianChange);
            }

            INTL_TRACE("Caching new UDateFormat (0x%x) with langtag=%s, pattern=%s, timezone=%s", dtf, langtag->GetSz(), pattern->GetSz(), timeZone->GetSz());

            // cache dtf for later use (so that the condition that brought us here returns true for future calls)
            state->SetInternalProperty(
                InternalPropertyIds::CachedUDateFormat,
                dtf,
                PropertyOperationFlags::PropertyOperation_None,
                nullptr
            );
        }

        // We intentionally special-case the following two calls to EnsureBuffer to allow zero-length strings.
        // See comment in GetPatternForSkeleton.

        char16 *formatted = nullptr;
        int formattedLen = 0;
        if (!toParts)
        {
            // if we aren't formatting to parts, we simply want to call udat_format with retry
            EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
            {
                return udat_format(*dtf, date, buf, bufLen, nullptr, status);
            }, scriptContext->GetRecycler(), &formatted, &formattedLen, /* allowZeroLengthStrings */ true);
            return JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext);
        }

        // The rest of this function most closely corresponds to ECMA 402 #sec-partitiondatetimepattern
        ScopedUFieldPositionIterator fpi(ufieldpositer_open(&status));
        ICU_ASSERT(status, true);
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return udat_formatForFields(*dtf, date, buf, bufLen, fpi, status);
        }, scriptContext->GetRecycler(), &formatted, &formattedLen, /* allowZeroLengthStrings */ true);

        JavascriptLibrary *library = scriptContext->GetLibrary();
        JavascriptArray* ret = library->CreateArray(0);

        int partStart = 0;
        int partEnd = 0;
        int lastPartEnd = 0;
        int i = 0;
        for (
            int kind = ufieldpositer_next(fpi, &partStart, &partEnd);
            kind >= 0;
            kind = ufieldpositer_next(fpi, &partStart, &partEnd), ++i
        )
        {
            Assert(partStart < partEnd && partEnd <= formattedLen);
            JavascriptString *typeString = nullptr;
            UDateFormatField fieldKind = (UDateFormatField)kind;
            switch (fieldKind)
            {
            case UDAT_ERA_FIELD:
                typeString = library->GetIntlEraPartString(); break;
            case UDAT_YEAR_FIELD:
            case UDAT_EXTENDED_YEAR_FIELD:
            case UDAT_YEAR_NAME_FIELD:
                typeString = library->GetIntlYearPartString(); break;
            case UDAT_MONTH_FIELD:
            case UDAT_STANDALONE_MONTH_FIELD:
                typeString = library->GetIntlMonthPartString(); break;
            case UDAT_DATE_FIELD:
                typeString = library->GetIntlDayPartString(); break;
            case UDAT_HOUR_OF_DAY1_FIELD:
            case UDAT_HOUR_OF_DAY0_FIELD:
            case UDAT_HOUR1_FIELD:
            case UDAT_HOUR0_FIELD:
                typeString = library->GetIntlHourPartString(); break;
            case UDAT_MINUTE_FIELD:
                typeString = library->GetIntlMinutePartString(); break;
            case UDAT_SECOND_FIELD:
                typeString = library->GetIntlSecondPartString(); break;
            case UDAT_DAY_OF_WEEK_FIELD:
            case UDAT_STANDALONE_DAY_FIELD:
            case UDAT_DOW_LOCAL_FIELD:
                typeString = library->GetIntlWeekdayPartString(); break;
            case UDAT_AM_PM_FIELD:
                typeString = library->GetIntlDayPeriodPartString(); break;
            case UDAT_TIMEZONE_FIELD:
            case UDAT_TIMEZONE_RFC_FIELD:
            case UDAT_TIMEZONE_GENERIC_FIELD:
            case UDAT_TIMEZONE_SPECIAL_FIELD:
            case UDAT_TIMEZONE_LOCALIZED_GMT_OFFSET_FIELD:
            case UDAT_TIMEZONE_ISO_FIELD:
            case UDAT_TIMEZONE_ISO_LOCAL_FIELD:
                typeString = library->GetIntlTimeZoneNamePartString(); break;
#if defined(ICU_VERSION) && ICU_VERSION == 55
            case UDAT_TIME_SEPARATOR_FIELD:
                // ICU 55 (Ubuntu 16.04 system default) has the ":" in "5:23 PM" as a special field
                // Intl should just treat this as a literal
                typeString = library->GetIntlLiteralPartString(); break;
#endif
            default:
                typeString = library->GetIntlUnknownPartString(); break;
            }

            if (partStart > lastPartEnd)
            {
                // formatForFields does not report literal fields directly, so we have to detect them
                // by seeing if the current part starts after the previous one ended
                AddPartToPartsArray(scriptContext, ret, i, formatted, lastPartEnd, partStart, library->GetIntlLiteralPartString());
                i += 1;
            }

            AddPartToPartsArray(scriptContext, ret, i, formatted, partStart, partEnd, typeString);
            lastPartEnd = partEnd;
        }

        // Sometimes, there can be a literal at the end of the string, such as when formatting just the year in
        // the chinese calendar, where the pattern string will be `r(U)`. The trailing `)` will be a literal
        if (lastPartEnd != formattedLen)
        {
            AssertOrFailFast(lastPartEnd < formattedLen);

            // `i` was incremented by the consequence of the last iteration of the for loop
            AddPartToPartsArray(scriptContext, ret, i, formatted, lastPartEnd, formattedLen, library->GetIntlLiteralPartString());
        }

        return ret;
#endif
    }